

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_cfdata_lzx(archive_read *a,ssize_t *avail)

{
  ushort uVar1;
  size_t __size;
  wchar_t wVar2;
  uchar *puVar3;
  int64_t iVar4;
  long local_50;
  ssize_t bytes_avail_1;
  ssize_t bytes_avail;
  uint16_t uavail;
  void *pvStack_38;
  wchar_t r;
  void *d;
  cfdata *cfdata;
  cab *cab;
  ssize_t *avail_local;
  archive_read *a_local;
  
  cfdata = (cfdata *)a->format->data;
  d = cfdata->sum_ptr;
  cab = (cab *)avail;
  avail_local = (ssize_t *)a;
  if (cfdata[2].memimage == (uchar *)0x0) {
    cfdata[2].sum_calculated = 0x8000;
    cfdata[2].sum_extra[0] = '\0';
    cfdata[2].sum_extra[1] = '\0';
    cfdata[2].sum_extra[2] = '\0';
    cfdata[2].sum_extra[3] = '\0';
    __size._0_4_ = cfdata[2].sum_calculated;
    __size._4_1_ = cfdata[2].sum_extra[0];
    __size._5_1_ = cfdata[2].sum_extra[1];
    __size._6_1_ = cfdata[2].sum_extra[2];
    __size._7_1_ = cfdata[2].sum_extra[3];
    puVar3 = (uchar *)malloc(__size);
    cfdata[2].memimage = puVar3;
    if (cfdata[2].memimage == (uchar *)0x0) {
      archive_set_error((archive *)avail_local,0xc,"No memory for CAB reader");
      cab->entry_offset = -0x1e;
      return (void *)0x0;
    }
  }
  bytes_avail._2_2_ = *(ushort *)((long)d + 0xc);
  if (bytes_avail._2_2_ == *(ushort *)((long)d + 8)) {
    a_local = (archive_read *)(cfdata[2].memimage + (int)(uint)*(ushort *)((long)d + 0xe));
    cab->entry_offset = (long)(int)((uint)bytes_avail._2_2_ - (uint)*(ushort *)((long)d + 0xe));
  }
  else {
    if (*(char *)(*(long *)&cfdata->sum_calculated + 0x5c) == '\0') {
      bytes_avail._4_4_ =
           lzx_decode_init((lzx_stream *)&cfdata[6].uncompressed_size,
                           (uint)*(ushort *)(*(long *)&cfdata->sum_calculated + 8));
      if (bytes_avail._4_4_ != L'\0') {
        archive_set_error((archive *)avail_local,-1,"Can\'t initialize LZX decompression.");
        cab->entry_offset = -0x1e;
        return (void *)0x0;
      }
      *(undefined1 *)(*(long *)&cfdata->sum_calculated + 0x5c) = 1;
      bytes_avail._4_4_ = L'\0';
    }
    lzx_cleanup_bitstream((lzx_stream *)&cfdata[6].uncompressed_size);
    *(ulong *)&cfdata[6].sum_extra_avail = (ulong)bytes_avail._2_2_;
    do {
      if ((long)(ulong)*(ushort *)((long)d + 8) <= *(long *)&cfdata[6].sum_extra_avail) {
        bytes_avail._2_2_ = (ushort)*(undefined8 *)&cfdata[6].sum_extra_avail;
        if (*(short *)((long)d + 6) != 0) {
          pvStack_38 = __archive_read_ahead
                                 ((archive_read *)avail_local,(ulong)*(ushort *)((long)d + 6),
                                  &local_50);
          if (local_50 < 1) {
            wVar2 = truncated_error((archive_read *)avail_local);
            cab->entry_offset = (long)wVar2;
            return (void *)0x0;
          }
          *(ulong *)((long)d + 0x10) = (ulong)*(ushort *)((long)d + 6);
          *(void **)((long)d + 0x38) = pvStack_38;
          iVar4 = cab_minimum_consume_cfdata
                            ((archive_read *)avail_local,*(int64_t *)((long)d + 0x10));
          if (iVar4 < 0) {
            cab->entry_offset = -0x1e;
            return (void *)0x0;
          }
        }
        lzx_translation((lzx_stream *)&cfdata[6].uncompressed_size,cfdata[2].memimage,
                        (ulong)*(ushort *)((long)d + 8),
                        (*(int *)(*(long *)&cfdata->sum_calculated + 0x58) + -1) * 0x8000);
        puVar3 = cfdata[2].memimage;
        uVar1 = *(ushort *)((long)d + 0xe);
        cab->entry_offset = (long)(int)((uint)bytes_avail._2_2_ - (uint)*(ushort *)((long)d + 0xe));
        *(ushort *)((long)d + 0xc) = bytes_avail._2_2_;
        return puVar3 + (int)(uint)uVar1;
      }
      cfdata[6].memimage = cfdata[2].memimage + *(long *)&cfdata[6].sum_extra_avail;
      *(ulong *)&cfdata[6].sum_calculated =
           (ulong)*(ushort *)((long)d + 8) - *(long *)&cfdata[6].sum_extra_avail;
      pvStack_38 = __archive_read_ahead((archive_read *)avail_local,1,&bytes_avail_1);
      if (pvStack_38 == (void *)0x0) {
        archive_set_error((archive *)avail_local,0x54,"Truncated CAB file data");
        cab->entry_offset = -0x1e;
        return (void *)0x0;
      }
      if ((long)(ulong)*(ushort *)((long)d + 6) < bytes_avail_1) {
        bytes_avail_1 = (ssize_t)*(ushort *)((long)d + 6);
      }
      *(void **)&cfdata[6].uncompressed_size = pvStack_38;
      cfdata[6].unconsumed = bytes_avail_1;
      cfdata[6].memimage_size = 0;
      bytes_avail._4_4_ =
           lzx_decode((lzx_stream *)&cfdata[6].uncompressed_size,
                      (uint)((ulong)*(ushort *)((long)d + 6) == bytes_avail_1));
      if (1 < (uint)bytes_avail._4_4_) {
        archive_set_error((archive *)avail_local,-1,"LZX decompression failed (%d)",
                          (ulong)(uint)bytes_avail._4_4_);
        cab->entry_offset = -0x1e;
        return (void *)0x0;
      }
      *(size_t *)((long)d + 0x10) = cfdata[6].memimage_size;
      *(void **)((long)d + 0x38) = pvStack_38;
      iVar4 = cab_minimum_consume_cfdata((archive_read *)avail_local,*(int64_t *)((long)d + 0x10));
    } while (-1 < iVar4);
    cab->entry_offset = -0x1e;
    a_local = (archive_read *)0x0;
  }
  return a_local;
}

Assistant:

static const void *
cab_read_ahead_cfdata_lzx(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	const void *d;
	int r;
	uint16_t uavail;

	cfdata = cab->entry_cfdata;
	/* If the buffer hasn't been allocated, allocate it now. */
	if (cab->uncompressed_buffer == NULL) {
		cab->uncompressed_buffer_size = 0x8000;
		cab->uncompressed_buffer
		    = malloc(cab->uncompressed_buffer_size);
		if (cab->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for CAB reader");
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}

	uavail = cfdata->uncompressed_avail;
	if (uavail == cfdata->uncompressed_size) {
		d = cab->uncompressed_buffer + cfdata->read_offset;
		*avail = uavail - cfdata->read_offset;
		return (d);
	}

	if (!cab->entry_cffolder->decompress_init) {
		r = lzx_decode_init(&cab->xstrm,
		    cab->entry_cffolder->compdata);
		if (r != ARCHIVE_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize LZX decompression.");
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
		/* We've initialized decompression for this stream. */
		cab->entry_cffolder->decompress_init = 1;
	}

	/* Clean up remaining bits of previous CFDATA. */
	lzx_cleanup_bitstream(&cab->xstrm);
	cab->xstrm.total_out = uavail;
	while (cab->xstrm.total_out < cfdata->uncompressed_size) {
		ssize_t bytes_avail;

		cab->xstrm.next_out =
		    cab->uncompressed_buffer + cab->xstrm.total_out;
		cab->xstrm.avail_out =
		    cfdata->uncompressed_size - cab->xstrm.total_out;

		d = __archive_read_ahead(a, 1, &bytes_avail);
		if (d == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated CAB file data");
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
		if (bytes_avail > cfdata->compressed_bytes_remaining)
			bytes_avail = cfdata->compressed_bytes_remaining;

		cab->xstrm.next_in = d;
		cab->xstrm.avail_in = bytes_avail;
		cab->xstrm.total_in = 0;
		r = lzx_decode(&cab->xstrm,
		    cfdata->compressed_bytes_remaining == bytes_avail);
		switch (r) {
		case ARCHIVE_OK:
		case ARCHIVE_EOF:
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "LZX decompression failed (%d)", r);
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
		cfdata->unconsumed = cab->xstrm.total_in;
		cfdata->sum_ptr = d;
		if (cab_minimum_consume_cfdata(a, cfdata->unconsumed) < 0) {
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}

	uavail = (uint16_t)cab->xstrm.total_out;
	/*
	 * Make sure a read pointer advances to next CFDATA.
	 */
	if (cfdata->compressed_bytes_remaining > 0) {
		ssize_t bytes_avail;

		d = __archive_read_ahead(a, cfdata->compressed_bytes_remaining,
		    &bytes_avail);
		if (bytes_avail <= 0) {
			*avail = truncated_error(a);
			return (NULL);
		}
		cfdata->unconsumed = cfdata->compressed_bytes_remaining;
		cfdata->sum_ptr = d;
		if (cab_minimum_consume_cfdata(a, cfdata->unconsumed) < 0) {
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}

	/*
	 * Translation reversal of x86 processor CALL byte sequence(E8).
	 */
	lzx_translation(&cab->xstrm, cab->uncompressed_buffer,
	    cfdata->uncompressed_size,
	    (cab->entry_cffolder->cfdata_index-1) * 0x8000);

	d = cab->uncompressed_buffer + cfdata->read_offset;
	*avail = uavail - cfdata->read_offset;
	cfdata->uncompressed_avail = uavail;

	return (d);
}